

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Tree::_free(Tree *this)

{
  code *pcVar1;
  bool bVar2;
  error_flags eVar3;
  long *in_RDI;
  char msg_1 [32];
  char msg [26];
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  char *in_stack_ffffffffffffff28;
  Location *in_stack_ffffffffffffff30;
  Tree *in_stack_ffffffffffffff40;
  char local_78 [48];
  undefined4 uStack_48;
  undefined4 uStack_44;
  undefined4 local_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  char *local_30;
  char local_28 [40];
  
  if (*in_RDI != 0) {
    if (in_RDI[1] == 0) {
      builtin_strncpy(local_28,"check failed: (m_cap > 0)",0x1a);
      eVar3 = get_error_flags();
      if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        trap_instruction();
      }
      pcVar1 = (code *)in_RDI[0xb];
      Location::Location(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                         CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                         CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                         CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      (*pcVar1)(local_28,0x1a,in_RDI[8]);
      in_stack_ffffffffffffff10 = uStack_48;
      in_stack_ffffffffffffff14 = uStack_44;
      in_stack_ffffffffffffff18 = local_40;
      in_stack_ffffffffffffff1c = uStack_3c;
      in_stack_ffffffffffffff20 = uStack_38;
      in_stack_ffffffffffffff24 = uStack_34;
      in_stack_ffffffffffffff28 = local_30;
    }
    (*(code *)in_RDI[10])(*in_RDI,in_RDI[1] * 0x90,in_RDI[8]);
    *in_RDI = 0;
  }
  if (in_RDI[5] != 0) {
    if (in_RDI[6] == 0) {
      builtin_strncpy(local_78,"check failed: (m_arena.len > 0)",0x20);
      eVar3 = get_error_flags();
      if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        trap_instruction();
      }
      in_stack_ffffffffffffff40 = (Tree *)in_RDI[0xb];
      Location::Location(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                         CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                         CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                         CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      (*(code *)in_stack_ffffffffffffff40)(local_78,0x20,in_RDI[8]);
    }
    (*(code *)in_RDI[10])(in_RDI[5],in_RDI[6],in_RDI[8]);
    in_RDI[5] = 0;
  }
  _clear(in_stack_ffffffffffffff40);
  return;
}

Assistant:

void Tree::_free()
{
    if(m_buf)
    {
        _RYML_CB_ASSERT(m_callbacks, m_cap > 0);
        _RYML_CB_FREE(m_callbacks, m_buf, NodeData, m_cap);
    }
    if(m_arena.str)
    {
        _RYML_CB_ASSERT(m_callbacks, m_arena.len > 0);
        _RYML_CB_FREE(m_callbacks, m_arena.str, char, m_arena.len);
    }
    _clear();
}